

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Path * __thiscall kj::PathPtr::eval(Path *__return_storage_ptr__,PathPtr *this,StringPtr pathText)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t extraout_RDX;
  size_t in_R8;
  String *value;
  long lVar4;
  StringPtr path;
  StringPtr path_00;
  StringPtr path_01;
  StringPtr path_02;
  Vector<kj::String> newParts;
  StringPtr local_70;
  ArrayBuilder<kj::String> local_60;
  Array<char> local_40;
  
  local_70.content.size_ = pathText.content.size_;
  local_70.content.ptr = pathText.content.ptr;
  local_60.ptr = (String *)0x254145;
  local_60.pos = (RemoveConst<kj::String> *)0x2;
  bVar1 = StringPtr::startsWith(&local_70,(StringPtr *)&local_60);
  if (bVar1) {
    path.content.size_ = extraout_RDX;
    path.content.ptr = (char *)local_70.content.size_;
    sVar2 = Path::countParts((Path *)local_70.content.ptr,path);
    local_60.ptr = _::HeapArrayDisposer::allocateUninitialized<kj::String>(sVar2);
    local_60.endPtr = local_60.ptr + sVar2;
    local_60.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    path_01.content.size_ = in_R8;
    path_01.content.ptr = (char *)local_70.content.size_;
    local_60.pos = local_60.ptr;
    Path::evalImpl(__return_storage_ptr__,(Path *)&local_60,
                   (Vector<kj::String> *)local_70.content.ptr,path_01);
  }
  else {
    sVar2 = (this->parts).size_;
    path_00.content.size_ = extraout_RDX;
    path_00.content.ptr = (char *)local_70.content.size_;
    sVar3 = Path::countParts((Path *)local_70.content.ptr,path_00);
    sVar3 = sVar3 + sVar2;
    local_60.ptr = _::HeapArrayDisposer::allocateUninitialized<kj::String>(sVar3);
    local_60.endPtr = local_60.ptr + sVar3;
    local_60.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    value = (this->parts).ptr;
    local_60.pos = local_60.ptr;
    for (lVar4 = (this->parts).size_ * 0x18; lVar4 != 0; lVar4 = lVar4 + -0x18) {
      heapString((String *)&local_40,value);
      Vector<kj::String>::add<kj::String>((Vector<kj::String> *)&local_60,(String *)&local_40);
      Array<char>::~Array(&local_40);
      value = value + 1;
    }
    path_02.content.size_ = in_R8;
    path_02.content.ptr = (char *)local_70.content.size_;
    Path::evalImpl(__return_storage_ptr__,(Path *)&local_60,
                   (Vector<kj::String> *)local_70.content.ptr,path_02);
  }
  ArrayBuilder<kj::String>::dispose(&local_60);
  return __return_storage_ptr__;
}

Assistant:

Path PathPtr::eval(StringPtr pathText) const {
  if (pathText.startsWith("/")) {
    // Optimization: avoid copying parts that will just be dropped.
    return Path::evalImpl(Vector<String>(Path::countParts(pathText)), pathText);
  } else {
    Vector<String> newParts(parts.size() + Path::countParts(pathText));
    for (auto& p: parts) newParts.add(heapString(p));
    return Path::evalImpl(kj::mv(newParts), pathText);
  }
}